

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
tinyusdz::GeomPrimvar::get_indices
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,GeomPrimvar *this,double t)

{
  bool bVar1;
  TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *this_00;
  vector<int,_std::allocator<int>_> *pvVar2;
  TimeCode local_28;
  double local_20;
  double t_local;
  GeomPrimvar *this_local;
  vector<int,_std::allocator<int>_> *indices;
  
  local_20 = t;
  t_local = (double)this;
  this_local = (GeomPrimvar *)__return_storage_ptr__;
  tinyusdz::value::TimeCode::TimeCode(&local_28,t);
  bVar1 = tinyusdz::value::TimeCode::is_default(&local_28);
  if ((bVar1) && (bVar1 = has_default_indices(this), bVar1)) {
    pvVar2 = get_default_indices(this);
    ::std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,pvVar2);
  }
  else {
    bVar1 = has_timesampled_indices(this);
    if (bVar1) {
      ::std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
      this_00 = get_timesampled_indices(this);
      bVar1 = TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::
              get<std::vector<int,_std::allocator<int>_>,_nullptr>
                        (this_00,__return_storage_ptr__,local_20,Linear);
      if (bVar1) {
        return __return_storage_ptr__;
      }
      ::std::vector<int,_std::allocator<int>_>::~vector(__return_storage_ptr__);
    }
    bVar1 = has_default_indices(this);
    if (bVar1) {
      pvVar2 = get_default_indices(this);
      ::std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,pvVar2);
    }
    else {
      memset(__return_storage_ptr__,0,0x18);
      ::std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int32_t> GeomPrimvar::get_indices(const double t) const {
  if (value::TimeCode(t).is_default()) {
    if (has_default_indices()) {
      return get_default_indices();
    }
  }
  
  if (has_timesampled_indices()) {
    std::vector<int32_t> indices;
    if (get_timesampled_indices().get(&indices, t)) {
      return indices;
    }
  }

  if (has_default_indices()) {
    return get_default_indices();
  }

  return std::vector<int32_t>();
}